

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

Variable * __thiscall soul::Optimisations::Inliner::getRemappedVariable(Inliner *this,Variable *old)

{
  string *psVar1;
  Allocator *pAVar2;
  pointer pcVar3;
  string *psVar4;
  mapped_type *pmVar5;
  long *plVar6;
  Variable *pVVar7;
  ulong uVar8;
  undefined8 uVar9;
  Identifier IVar10;
  string_view newString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_c0;
  long local_b8;
  ulong local_b0 [2];
  key_type local_a0;
  size_t local_98;
  _func_int **local_90;
  Ptr PStack_88;
  string local_80;
  Identifier local_60;
  Identifier local_58;
  string local_50;
  
  if (2 < old->role - mutableLocal) {
    return old;
  }
  local_a0.object = old;
  pmVar5 = std::__detail::
           _Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<soul::pool_ref<soul::heart::Variable>,_std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->remappedVariables,&local_a0);
  if (pmVar5->object != (Variable *)0x0) goto LAB_0027c47e;
  IVar10.name = (string *)this->module;
  psVar1 = (old->name).name;
  if (psVar1 == (string *)0x0) {
    local_58.name = (string *)0x0;
  }
  else {
    pAVar2 = ((Module *)IVar10.name)->allocator;
    pcVar3 = (this->inlinedFnName)._M_dataplus._M_p;
    local_c0 = local_b0;
    local_60.name = IVar10.name;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar3,pcVar3 + (this->inlinedFnName)._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    psVar4 = (old->name).name;
    if (psVar4 == (string *)0x0) {
      throwInternalCompilerError("isValid()","operator const std::basic_string<char> &",0x21);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar3 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + psVar4->_M_string_length);
    makeSafeIdentifierName(&local_80,&local_50);
    uVar8 = 0xf;
    if (local_c0 != local_b0) {
      uVar8 = local_b0[0];
    }
    if (uVar8 < local_80._M_string_length + local_b8) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        uVar9 = local_80.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_80._M_string_length + local_b8) goto LAB_0027c337;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_c0)
      ;
    }
    else {
LAB_0027c337:
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_c0,(ulong)local_80._M_dataplus._M_p);
    }
    local_a0.object = (Variable *)&local_90;
    pVVar7 = (Variable *)(plVar6 + 2);
    if ((Variable *)*plVar6 == pVVar7) {
      local_90 = (pVVar7->super_Expression).super_Object._vptr_Object;
      PStack_88.object = (SourceCodeText *)plVar6[3];
    }
    else {
      local_90 = (pVVar7->super_Expression).super_Object._vptr_Object;
      local_a0.object = (Variable *)*plVar6;
    }
    local_98 = plVar6[1];
    *plVar6 = (long)pVVar7;
    plVar6[1] = 0;
    *(undefined1 *)&(pVVar7->super_Expression).super_Object._vptr_Object = 0;
    newString._M_str = (char *)local_a0.object;
    newString._M_len = local_98;
    local_58 = Identifier::Pool::get(&pAVar2->identifiers,newString);
    IVar10.name = local_60.name;
  }
  pVVar7 = PoolAllocator::
           allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier,soul::heart::Variable::Role&>
                     (&((Module *)IVar10.name)->allocator->pool,
                      &(old->super_Expression).super_Object.location,&old->type,&local_58,&old->role
                     );
  pmVar5->object = pVVar7;
  if (psVar1 != (string *)0x0) {
    if (local_a0.object != (Variable *)&local_90) {
      operator_delete(local_a0.object,(long)local_90 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0,local_b0[0] + 1);
    }
  }
  if (pmVar5->object == (Variable *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  Annotation::operator=(&pmVar5->object->annotation,&old->annotation);
LAB_0027c47e:
  if (pmVar5->object != (Variable *)0x0) {
    return pmVar5->object;
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
        {
            if (old.isFunctionLocal() || old.isParameter())
            {
                auto& v = remappedVariables[old];

                if (v == nullptr)
                {
                    v = module.allocate<heart::Variable> (old.location, old.type,
                                                          old.name.isValid() ? module.allocator.get (inlinedFnName + "_" + makeSafeIdentifierName (old.name))
                                                                             : Identifier(),
                                                          old.role);
                    v->annotation = old.annotation;
                }

                return *v;
            }

            return old;
        }